

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall Board::setFrame(Board *this)

{
  int i_1;
  int i;
  Board *this_local;
  
  this->rows[0x15] = 0;
  this->rows[0] = 0xfff;
  this->cols[0xb] = 0x1fffff;
  this->cols[0] = 0x1fffff;
  for (i = 1; i < 0x15; i = i + 1) {
    this->rows[i] = 0x801;
  }
  for (i_1 = 1; i_1 < 0xb; i_1 = i_1 + 1) {
    this->cols[i_1] = 1;
  }
  return;
}

Assistant:

void Board::setFrame(){
    rows[MAPHEIGHT + 1] = 0;
    rows[0] = FULL_ROW;
    cols[0] = cols[MAPWIDTH + 1] = FULL_COL;
    for (int i = 1; i <= MAPHEIGHT; ++i)
        rows[i] = EMPTY_ROW;
    for (int i = 1; i <= MAPWIDTH; ++i)
        cols[i] = EMPTY_COL;
}